

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O0

int __thiscall TPZBlockDiagonal<float>::Decompose_LU(TPZBlockDiagonal<float> *this)

{
  int64_t index;
  int64_t iVar1;
  long *plVar2;
  int *piVar3;
  long in_RDI;
  list<long,_std::allocator<long>_> singular;
  TPZFMatrix<float> temp;
  int bsize;
  int64_t pos;
  int64_t nb;
  int64_t b;
  char *in_stack_00000100;
  int64_t in_stack_ffffffffffffff40;
  float *in_stack_ffffffffffffff48;
  int64_t in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff58;
  TPZFMatrix<float> *in_stack_ffffffffffffff60;
  TPZFMatrix<float> *in_stack_ffffffffffffff68;
  undefined8 local_18;
  
  if ((*(char *)(in_RDI + 0x18) == '\0') || (*(char *)(in_RDI + 0x18) != '\x01')) {
    if (*(char *)(in_RDI + 0x18) != '\0') {
      TPZMatrix<float>::Error(in_stack_00000100,(char *)this);
    }
    iVar1 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x60));
    for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
      plVar2 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x40),local_18);
      index = *plVar2;
      piVar3 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x60),local_18);
      if (*piVar3 != 0) {
        TPZVec<float>::operator[]((TPZVec<float> *)(in_RDI + 0x20),index);
        TPZFMatrix<float>::TPZFMatrix
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
        std::__cxx11::list<long,_std::allocator<long>_>::list
                  ((list<long,_std::allocator<long>_> *)0x11e8a5b);
        TPZFMatrix<float>::Decompose_LU
                  (in_stack_ffffffffffffff68,
                   (list<long,_std::allocator<long>_> *)in_stack_ffffffffffffff60);
        std::__cxx11::list<long,_std::allocator<long>_>::~list
                  ((list<long,_std::allocator<long>_> *)0x11e8a76);
        TPZFMatrix<float>::~TPZFMatrix((TPZFMatrix<float> *)0x11e8a80);
      }
    }
    *(undefined1 *)(in_RDI + 0x18) = 1;
  }
  return 1;
}

Assistant:

int TPZBlockDiagonal<TVar>::Decompose_LU()
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZBlockDiagonal::Decompose_LU");
#endif
	
	if (  this->fDecomposed && this->fDecomposed == ELU) {
		return ELU;
	} else if(this->fDecomposed) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is already decomposed with other scheme");
	}
	
	int64_t b,nb,pos;
	int bsize;
	nb = fBlockSize.NElements();
	for(b=0;b<nb; b++) {
		pos = fBlockPos[b];
		bsize = fBlockSize[b];
		if(!bsize) continue;
		
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
        {
            std::stringstream mess;
            mess << "TPZBlockDiagonal::Decompose_LU() - bsize = " << bsize << ", bsize*bsize = " << bsize*bsize;
            LOGPZ_DEBUG(logger,mess.str());
        }
#endif
		
		TPZFMatrix<TVar> temp(bsize,bsize,&fStorage[pos],bsize*bsize);
		std::list<int64_t> singular;
		temp.Decompose_LU(singular);
	}
	this->fDecomposed = ELU;
	return 1;
}